

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O2

void __thiscall OpenMD::Globals::Globals(Globals *this)

{
  ParamMap *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FluctuatingChargeParameters *this_04;
  RNEMDParameters *this_05;
  LightParameters *this_06;
  MinimizerParameters *this_07;
  allocator<char> local_349;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  size_type local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_328;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_300;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2f8;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2f0;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e8;
  ParameterBase *local_2e0;
  ParameterBase *local_2d8;
  ParameterBase *local_2d0;
  ParameterBase *local_2c8;
  ParameterBase *local_2c0;
  ParameterBase *local_2b8;
  ParameterBase *local_2b0;
  ParameterBase *local_2a8;
  ParameterBase *local_2a0;
  ParameterBase *local_298;
  ParameterBase *local_290;
  ParameterBase *local_288;
  ParameterBase *local_280;
  ParameterBase *local_278;
  ParameterBase *local_270;
  ParameterBase *local_268;
  ParameterBase *local_260;
  ParameterBase *local_258;
  ParameterBase *local_250;
  ParameterBase *local_248;
  ParameterBase *local_240;
  ParameterBase *local_238;
  ParameterBase *local_230;
  ParameterBase *local_228;
  ParameterBase *local_220;
  ParameterBase *local_218;
  ParameterBase *local_210;
  ParameterBase *local_208;
  ParameterBase *local_200;
  ParameterBase *local_1f8;
  ParameterBase *local_1f0;
  ParameterBase *local_1e8;
  ParameterBase *local_1e0;
  ParameterBase *local_1d8;
  ParameterBase *local_1d0;
  ParameterBase *local_1c8;
  ParameterBase *local_1c0;
  ParameterBase *local_1b8;
  ParameterBase *local_1b0;
  ParameterBase *local_1a8;
  ParameterBase *local_1a0;
  ParameterBase *local_198;
  ParameterBase *local_190;
  ParameterBase *local_188;
  ParameterBase *local_180;
  ParameterBase *local_178;
  ParameterBase *local_170;
  ParameterBase *local_168;
  ParameterBase *local_160;
  ParameterBase *local_158;
  ParameterBase *local_150;
  ParameterBase *local_148;
  ParameterBase *local_140;
  ParameterBase *local_138;
  ParameterBase *local_130;
  ParameterBase *local_128;
  ParameterBase *local_120;
  ParameterBase *local_118;
  ParameterBase *local_110;
  ParameterBase *local_108;
  ParameterBase *local_100;
  ParameterBase *local_f8;
  ParameterBase *local_f0;
  ParameterBase *local_e8;
  ParameterBase *local_e0;
  ParameterBase *local_d8;
  ParameterBase *local_d0;
  ParameterBase *local_c8;
  ParameterBase *local_c0;
  ParameterBase *local_b8;
  ParameterBase *local_b0;
  ParameterBase *local_a8;
  ParameterBase *local_a0;
  ParameterBase *local_98;
  ParameterBase *local_90;
  ParameterBase *local_88;
  ParameterBase *local_80;
  ParameterBase *local_78;
  ParameterBase *local_70;
  ParameterBase *local_68;
  ParameterBase *local_60;
  ParameterBase *local_58;
  ParameterBase *local_50;
  ParameterBase *local_48;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__Globals_002be240;
  local_48 = &(this->ForceField).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_48);
  local_50 = &(this->TargetTemp).super_ParameterBase;
  (this->TargetTemp).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TargetTemp).super_ParameterBase.keyword_.field_2;
  (this->TargetTemp).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TargetTemp).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TargetTemp).super_ParameterBase.optional_ = false;
  (this->TargetTemp).super_ParameterBase.defaultValue_ = false;
  (this->TargetTemp).super_ParameterBase.empty_ = true;
  (this->TargetTemp).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  local_58 = &(this->Ensemble).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_58);
  local_60 = &(this->Dt).super_ParameterBase;
  (this->Dt).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Dt).super_ParameterBase.keyword_.field_2;
  (this->Dt).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Dt).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Dt).super_ParameterBase.optional_ = false;
  (this->Dt).super_ParameterBase.defaultValue_ = false;
  (this->Dt).super_ParameterBase.empty_ = true;
  (this->Dt).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->RunTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->RunTime).super_ParameterBase.keyword_.field_2;
  (this->RunTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RunTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RunTime).super_ParameterBase.optional_ = false;
  (this->RunTime).super_ParameterBase.defaultValue_ = false;
  local_68 = &(this->RunTime).super_ParameterBase;
  (this->RunTime).super_ParameterBase.empty_ = true;
  (this->RunTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  local_70 = &(this->FinalConfig).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_70);
  (this->SampleTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SampleTime).super_ParameterBase.keyword_.field_2;
  (this->SampleTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SampleTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SampleTime).super_ParameterBase.optional_ = false;
  (this->SampleTime).super_ParameterBase.defaultValue_ = false;
  (this->SampleTime).super_ParameterBase.empty_ = true;
  (this->SampleTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->ResetTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ResetTime).super_ParameterBase.keyword_.field_2;
  (this->ResetTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ResetTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ResetTime).super_ParameterBase.optional_ = false;
  (this->ResetTime).super_ParameterBase.defaultValue_ = false;
  (this->ResetTime).super_ParameterBase.empty_ = true;
  (this->ResetTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->StatusTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->StatusTime).super_ParameterBase.keyword_.field_2;
  (this->StatusTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->StatusTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->StatusTime).super_ParameterBase.optional_ = false;
  (this->StatusTime).super_ParameterBase.defaultValue_ = false;
  (this->StatusTime).super_ParameterBase.empty_ = true;
  (this->StatusTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->CutoffRadius).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->CutoffRadius).super_ParameterBase.keyword_.field_2;
  (this->CutoffRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CutoffRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CutoffRadius).super_ParameterBase.optional_ = false;
  (this->CutoffRadius).super_ParameterBase.defaultValue_ = false;
  local_78 = &(this->SampleTime).super_ParameterBase;
  (this->CutoffRadius).super_ParameterBase.empty_ = true;
  (this->CutoffRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->SwitchingRadius).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SwitchingRadius).super_ParameterBase.keyword_.field_2;
  (this->SwitchingRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SwitchingRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SwitchingRadius).super_ParameterBase.optional_ = false;
  (this->SwitchingRadius).super_ParameterBase.defaultValue_ = false;
  local_80 = &(this->ResetTime).super_ParameterBase;
  (this->SwitchingRadius).super_ParameterBase.empty_ = true;
  (this->SwitchingRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->TempSet).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TempSet).super_ParameterBase.keyword_.field_2;
  (this->TempSet).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TempSet).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TempSet).super_ParameterBase.optional_ = false;
  (this->TempSet).super_ParameterBase.defaultValue_ = false;
  (this->TempSet).super_ParameterBase.empty_ = true;
  (this->TempSet).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->ThermalTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ThermalTime).super_ParameterBase.keyword_.field_2;
  (this->ThermalTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ThermalTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ThermalTime).super_ParameterBase.optional_ = false;
  (this->ThermalTime).super_ParameterBase.defaultValue_ = false;
  local_88 = &(this->StatusTime).super_ParameterBase;
  (this->ThermalTime).super_ParameterBase.empty_ = true;
  (this->ThermalTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_.field_2;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.optional_ = false;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.defaultValue_ = false;
  local_90 = &(this->CutoffRadius).super_ParameterBase;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.empty_ = true;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->ConserveLinearMomentum).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ConserveLinearMomentum).super_ParameterBase.keyword_.field_2;
  (this->ConserveLinearMomentum).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConserveLinearMomentum).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConserveLinearMomentum).super_ParameterBase.optional_ = false;
  (this->ConserveLinearMomentum).super_ParameterBase.defaultValue_ = false;
  local_98 = &(this->SwitchingRadius).super_ParameterBase;
  (this->ConserveLinearMomentum).super_ParameterBase.empty_ = true;
  (this->ConserveLinearMomentum).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->ConserveAngularMomentum).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ConserveAngularMomentum).super_ParameterBase.keyword_.field_2;
  (this->ConserveAngularMomentum).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConserveAngularMomentum).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConserveAngularMomentum).super_ParameterBase.optional_ = false;
  (this->ConserveAngularMomentum).super_ParameterBase.defaultValue_ = false;
  local_a0 = &(this->TempSet).super_ParameterBase;
  (this->ConserveAngularMomentum).super_ParameterBase.empty_ = true;
  (this->ConserveAngularMomentum).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->TargetPressure).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TargetPressure).super_ParameterBase.keyword_.field_2;
  (this->TargetPressure).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TargetPressure).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TargetPressure).super_ParameterBase.optional_ = false;
  (this->TargetPressure).super_ParameterBase.defaultValue_ = false;
  local_a8 = &(this->ThermalTime).super_ParameterBase;
  (this->TargetPressure).super_ParameterBase.empty_ = true;
  (this->TargetPressure).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->UseAtomicVirial).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseAtomicVirial).super_ParameterBase.keyword_.field_2;
  (this->UseAtomicVirial).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseAtomicVirial).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseAtomicVirial).super_ParameterBase.optional_ = false;
  (this->UseAtomicVirial).super_ParameterBase.defaultValue_ = false;
  local_1f0 = &(this->UsePeriodicBoundaryConditions).super_ParameterBase;
  (this->UseAtomicVirial).super_ParameterBase.empty_ = true;
  (this->UseAtomicVirial).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->UseLongRangeCorrections).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseLongRangeCorrections).super_ParameterBase.keyword_.field_2;
  (this->UseLongRangeCorrections).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseLongRangeCorrections).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseLongRangeCorrections).super_ParameterBase.optional_ = false;
  (this->UseLongRangeCorrections).super_ParameterBase.defaultValue_ = false;
  local_200 = &(this->ConserveLinearMomentum).super_ParameterBase;
  (this->UseLongRangeCorrections).super_ParameterBase.empty_ = true;
  (this->UseLongRangeCorrections).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->TauThermostat).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TauThermostat).super_ParameterBase.keyword_.field_2;
  (this->TauThermostat).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TauThermostat).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TauThermostat).super_ParameterBase.optional_ = false;
  (this->TauThermostat).super_ParameterBase.defaultValue_ = false;
  local_208 = &(this->ConserveAngularMomentum).super_ParameterBase;
  (this->TauThermostat).super_ParameterBase.empty_ = true;
  (this->TauThermostat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->TauBarostat).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->TauBarostat).super_ParameterBase.keyword_.field_2;
  (this->TauBarostat).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TauBarostat).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TauBarostat).super_ParameterBase.optional_ = false;
  (this->TauBarostat).super_ParameterBase.defaultValue_ = false;
  local_b0 = &(this->TargetPressure).super_ParameterBase;
  (this->TauBarostat).super_ParameterBase.empty_ = true;
  (this->TauBarostat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->LangevinPistonDrag).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->LangevinPistonDrag).super_ParameterBase.keyword_.field_2;
  (this->LangevinPistonDrag).super_ParameterBase.keyword_._M_string_length = 0;
  (this->LangevinPistonDrag).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->LangevinPistonDrag).super_ParameterBase.optional_ = false;
  (this->LangevinPistonDrag).super_ParameterBase.defaultValue_ = false;
  (this->LangevinPistonDrag).super_ParameterBase.empty_ = true;
  (this->LangevinPistonDrag).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->ZconsTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ZconsTime).super_ParameterBase.keyword_.field_2;
  (this->ZconsTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsTime).super_ParameterBase.optional_ = false;
  (this->ZconsTime).super_ParameterBase.defaultValue_ = false;
  (this->ZconsTime).super_ParameterBase.empty_ = true;
  (this->ZconsTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->ZconsTol).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ZconsTol).super_ParameterBase.keyword_.field_2;
  local_218 = &(this->UseAtomicVirial).super_ParameterBase;
  (this->ZconsTol).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsTol).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  local_228 = &(this->UseLongRangeCorrections).super_ParameterBase;
  (this->ZconsTol).super_ParameterBase.optional_ = false;
  (this->ZconsTol).super_ParameterBase.defaultValue_ = false;
  (this->ZconsTol).super_ParameterBase.empty_ = true;
  local_b8 = &(this->TauThermostat).super_ParameterBase;
  (this->ZconsTol).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  local_c0 = &(this->TauBarostat).super_ParameterBase;
  local_c8 = &(this->LangevinPistonDrag).super_ParameterBase;
  local_d0 = &(this->ZconsTime).super_ParameterBase;
  local_d8 = &(this->ZconsTol).super_ParameterBase;
  local_e0 = &(this->ZconsForcePolicy).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_e0);
  (this->Seed).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Seed).super_ParameterBase.keyword_.field_2;
  (this->Seed).super_ParameterBase.keyword_._M_string_length = 0;
  local_e8 = &(this->Seed).super_ParameterBase;
  (this->Seed).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Seed).super_ParameterBase.optional_ = false;
  (this->Seed).super_ParameterBase.defaultValue_ = false;
  (this->Seed).super_ParameterBase.empty_ = true;
  (this->Seed).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002be280;
  (this->UseInitalTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseInitalTime).super_ParameterBase.keyword_.field_2;
  (this->UseInitalTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseInitalTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseInitalTime).super_ParameterBase.optional_ = false;
  (this->UseInitalTime).super_ParameterBase.defaultValue_ = false;
  local_240 = &(this->UseInitalTime).super_ParameterBase;
  (this->UseInitalTime).super_ParameterBase.empty_ = true;
  (this->UseInitalTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->UseIntialExtendedSystemState).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseIntialExtendedSystemState).super_ParameterBase.keyword_.field_2;
  (this->UseIntialExtendedSystemState).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseIntialExtendedSystemState).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseIntialExtendedSystemState).super_ParameterBase.optional_ = false;
  (this->UseIntialExtendedSystemState).super_ParameterBase.defaultValue_ = false;
  local_248 = &(this->UseIntialExtendedSystemState).super_ParameterBase;
  (this->UseIntialExtendedSystemState).super_ParameterBase.empty_ = true;
  (this->UseIntialExtendedSystemState).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->OrthoBoxTolerance).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OrthoBoxTolerance).super_ParameterBase.keyword_.field_2;
  (this->OrthoBoxTolerance).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OrthoBoxTolerance).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OrthoBoxTolerance).super_ParameterBase.optional_ = false;
  (this->OrthoBoxTolerance).super_ParameterBase.defaultValue_ = false;
  local_250 = &(this->OrthoBoxTolerance).super_ParameterBase;
  (this->OrthoBoxTolerance).super_ParameterBase.empty_ = true;
  (this->OrthoBoxTolerance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->ZconsGap).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ZconsGap).super_ParameterBase.keyword_.field_2;
  (this->ZconsGap).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsGap).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsGap).super_ParameterBase.optional_ = false;
  (this->ZconsGap).super_ParameterBase.defaultValue_ = false;
  local_f0 = &(this->ZconsGap).super_ParameterBase;
  (this->ZconsGap).super_ParameterBase.empty_ = true;
  (this->ZconsGap).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->ZconsFixtime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ZconsFixtime).super_ParameterBase.keyword_.field_2;
  (this->ZconsFixtime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsFixtime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsFixtime).super_ParameterBase.optional_ = false;
  (this->ZconsFixtime).super_ParameterBase.defaultValue_ = false;
  local_f8 = &(this->ZconsFixtime).super_ParameterBase;
  (this->ZconsFixtime).super_ParameterBase.empty_ = true;
  (this->ZconsFixtime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->ZconsUsingSMD).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ZconsUsingSMD).super_ParameterBase.keyword_.field_2;
  (this->ZconsUsingSMD).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsUsingSMD).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsUsingSMD).super_ParameterBase.optional_ = false;
  (this->ZconsUsingSMD).super_ParameterBase.defaultValue_ = false;
  local_100 = &(this->ZconsUsingSMD).super_ParameterBase;
  (this->ZconsUsingSMD).super_ParameterBase.empty_ = true;
  (this->ZconsUsingSMD).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->UseThermodynamicIntegration).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseThermodynamicIntegration).super_ParameterBase.keyword_.field_2;
  (this->UseThermodynamicIntegration).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseThermodynamicIntegration).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseThermodynamicIntegration).super_ParameterBase.optional_ = false;
  (this->UseThermodynamicIntegration).super_ParameterBase.defaultValue_ = false;
  local_2c8 = &(this->UseThermodynamicIntegration).super_ParameterBase;
  (this->UseThermodynamicIntegration).super_ParameterBase.empty_ = true;
  (this->UseThermodynamicIntegration).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_.field_2;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0'
  ;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.optional_ = false;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.defaultValue_ = false;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.empty_ = true;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->ThermodynamicIntegrationK).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ThermodynamicIntegrationK).super_ParameterBase.keyword_.field_2;
  local_108 = &(this->ThermodynamicIntegrationLambda).super_ParameterBase;
  (this->ThermodynamicIntegrationK).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ThermodynamicIntegrationK).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ThermodynamicIntegrationK).super_ParameterBase.optional_ = false;
  (this->ThermodynamicIntegrationK).super_ParameterBase.defaultValue_ = false;
  local_110 = &(this->ThermodynamicIntegrationK).super_ParameterBase;
  (this->ThermodynamicIntegrationK).super_ParameterBase.empty_ = true;
  (this->ThermodynamicIntegrationK).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  local_118 = &(this->ForceFieldVariant).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_118);
  local_120 = &(this->ForceFieldFileName).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_120);
  local_128 = &(this->SurfaceTension).super_ParameterBase;
  (this->SurfaceTension).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SurfaceTension).super_ParameterBase.keyword_.field_2;
  (this->SurfaceTension).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SurfaceTension).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SurfaceTension).super_ParameterBase.optional_ = false;
  (this->SurfaceTension).super_ParameterBase.defaultValue_ = false;
  (this->SurfaceTension).super_ParameterBase.empty_ = true;
  (this->SurfaceTension).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->PrintPressureTensor).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PrintPressureTensor).super_ParameterBase.keyword_.field_2;
  (this->PrintPressureTensor).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintPressureTensor).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintPressureTensor).super_ParameterBase.optional_ = false;
  (this->PrintPressureTensor).super_ParameterBase.defaultValue_ = false;
  local_138 = &(this->PrintPressureTensor).super_ParameterBase;
  (this->PrintPressureTensor).super_ParameterBase.empty_ = true;
  (this->PrintPressureTensor).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->PrintVirialTensor).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PrintVirialTensor).super_ParameterBase.keyword_.field_2;
  (this->PrintVirialTensor).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintVirialTensor).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintVirialTensor).super_ParameterBase.optional_ = false;
  (this->PrintVirialTensor).super_ParameterBase.defaultValue_ = false;
  local_140 = &(this->PrintVirialTensor).super_ParameterBase;
  (this->PrintVirialTensor).super_ParameterBase.empty_ = true;
  (this->PrintVirialTensor).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->PrintHeatFlux).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PrintHeatFlux).super_ParameterBase.keyword_.field_2;
  (this->PrintHeatFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintHeatFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintHeatFlux).super_ParameterBase.optional_ = false;
  (this->PrintHeatFlux).super_ParameterBase.defaultValue_ = false;
  local_270 = &(this->PrintHeatFlux).super_ParameterBase;
  (this->PrintHeatFlux).super_ParameterBase.empty_ = true;
  (this->PrintHeatFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  local_158 = &(this->TaggedAtomPair).super_ParameterBase;
  Parameter<std::pair<int,_int>_>::Parameter((Parameter<std::pair<int,_int>_> *)local_158);
  (this->PrintTaggedPairDistance).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PrintTaggedPairDistance).super_ParameterBase.keyword_.field_2;
  (this->PrintTaggedPairDistance).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintTaggedPairDistance).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintTaggedPairDistance).super_ParameterBase.optional_ = false;
  (this->PrintTaggedPairDistance).super_ParameterBase.defaultValue_ = false;
  local_168 = &(this->PrintTaggedPairDistance).super_ParameterBase;
  (this->PrintTaggedPairDistance).super_ParameterBase.empty_ = true;
  (this->PrintTaggedPairDistance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  local_1b8 = &(this->ElectrostaticSummationMethod).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_1b8);
  local_2f0 = &this->ElectrostaticScreeningMethod;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_2f0);
  local_258 = &(this->UseSurfaceTerm).super_ParameterBase;
  (this->UseSurfaceTerm).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseSurfaceTerm).super_ParameterBase.keyword_.field_2;
  (this->UseSurfaceTerm).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseSurfaceTerm).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseSurfaceTerm).super_ParameterBase.optional_ = false;
  (this->UseSurfaceTerm).super_ParameterBase.defaultValue_ = false;
  (this->UseSurfaceTerm).super_ParameterBase.empty_ = true;
  (this->UseSurfaceTerm).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->UseSlabGeometry).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseSlabGeometry).super_ParameterBase.keyword_.field_2;
  (this->UseSlabGeometry).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseSlabGeometry).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseSlabGeometry).super_ParameterBase.optional_ = false;
  (this->UseSlabGeometry).super_ParameterBase.defaultValue_ = false;
  local_260 = &(this->UseSlabGeometry).super_ParameterBase;
  (this->UseSlabGeometry).super_ParameterBase.empty_ = true;
  (this->UseSlabGeometry).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->DampingAlpha).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->DampingAlpha).super_ParameterBase.keyword_.field_2;
  (this->DampingAlpha).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DampingAlpha).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DampingAlpha).super_ParameterBase.optional_ = false;
  (this->DampingAlpha).super_ParameterBase.defaultValue_ = false;
  local_130 = &(this->DampingAlpha).super_ParameterBase;
  (this->DampingAlpha).super_ParameterBase.empty_ = true;
  (this->DampingAlpha).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->Dielectric).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Dielectric).super_ParameterBase.keyword_.field_2;
  (this->Dielectric).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Dielectric).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Dielectric).super_ParameterBase.optional_ = false;
  (this->Dielectric).super_ParameterBase.defaultValue_ = false;
  local_268 = &(this->Dielectric).super_ParameterBase;
  (this->Dielectric).super_ParameterBase.empty_ = true;
  (this->Dielectric).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  local_2e8 = &this->CutoffMethod;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_2e8);
  local_188 = &(this->SwitchingFunctionType).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_188);
  local_278 = &(this->CompressDumpFile).super_ParameterBase;
  (this->CompressDumpFile).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->CompressDumpFile).super_ParameterBase.keyword_.field_2;
  (this->CompressDumpFile).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CompressDumpFile).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CompressDumpFile).super_ParameterBase.optional_ = false;
  (this->CompressDumpFile).super_ParameterBase.defaultValue_ = false;
  (this->CompressDumpFile).super_ParameterBase.empty_ = true;
  (this->CompressDumpFile).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->OutputForceVector).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputForceVector).super_ParameterBase.keyword_.field_2;
  (this->OutputForceVector).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputForceVector).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputForceVector).super_ParameterBase.optional_ = false;
  (this->OutputForceVector).super_ParameterBase.defaultValue_ = false;
  local_280 = &(this->OutputForceVector).super_ParameterBase;
  (this->OutputForceVector).super_ParameterBase.empty_ = true;
  (this->OutputForceVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->OutputParticlePotential).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputParticlePotential).super_ParameterBase.keyword_.field_2;
  (this->OutputParticlePotential).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputParticlePotential).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputParticlePotential).super_ParameterBase.optional_ = false;
  (this->OutputParticlePotential).super_ParameterBase.defaultValue_ = false;
  local_288 = &(this->OutputParticlePotential).super_ParameterBase;
  (this->OutputParticlePotential).super_ParameterBase.empty_ = true;
  (this->OutputParticlePotential).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->OutputElectricField).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputElectricField).super_ParameterBase.keyword_.field_2;
  (this->OutputElectricField).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputElectricField).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputElectricField).super_ParameterBase.optional_ = false;
  (this->OutputElectricField).super_ParameterBase.defaultValue_ = false;
  local_290 = &(this->OutputElectricField).super_ParameterBase;
  (this->OutputElectricField).super_ParameterBase.empty_ = true;
  (this->OutputElectricField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->OutputFluctuatingCharges).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputFluctuatingCharges).super_ParameterBase.keyword_.field_2;
  (this->OutputFluctuatingCharges).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputFluctuatingCharges).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputFluctuatingCharges).super_ParameterBase.optional_ = false;
  (this->OutputFluctuatingCharges).super_ParameterBase.defaultValue_ = false;
  local_298 = &(this->OutputFluctuatingCharges).super_ParameterBase;
  (this->OutputFluctuatingCharges).super_ParameterBase.empty_ = true;
  (this->OutputFluctuatingCharges).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->OutputSitePotential).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputSitePotential).super_ParameterBase.keyword_.field_2;
  (this->OutputSitePotential).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputSitePotential).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputSitePotential).super_ParameterBase.optional_ = false;
  (this->OutputSitePotential).super_ParameterBase.defaultValue_ = false;
  local_2a0 = &(this->OutputSitePotential).super_ParameterBase;
  (this->OutputSitePotential).super_ParameterBase.empty_ = true;
  (this->OutputSitePotential).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->OutputDensity).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->OutputDensity).super_ParameterBase.keyword_.field_2;
  (this->OutputDensity).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputDensity).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputDensity).super_ParameterBase.optional_ = false;
  (this->OutputDensity).super_ParameterBase.defaultValue_ = false;
  local_2a8 = &(this->OutputDensity).super_ParameterBase;
  (this->OutputDensity).super_ParameterBase.empty_ = true;
  (this->OutputDensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->SkinThickness).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SkinThickness).super_ParameterBase.keyword_.field_2;
  (this->SkinThickness).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SkinThickness).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SkinThickness).super_ParameterBase.optional_ = false;
  (this->SkinThickness).super_ParameterBase.defaultValue_ = false;
  local_2b0 = &(this->SkinThickness).super_ParameterBase;
  (this->SkinThickness).super_ParameterBase.empty_ = true;
  (this->SkinThickness).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  local_2f8 = &this->StatFileFormat;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_2f8);
  local_2b8 = &(this->StatFilePrecision).super_ParameterBase;
  (this->StatFilePrecision).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->StatFilePrecision).super_ParameterBase.keyword_.field_2;
  (this->StatFilePrecision).super_ParameterBase.keyword_._M_string_length = 0;
  (this->StatFilePrecision).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->StatFilePrecision).super_ParameterBase.optional_ = false;
  (this->StatFilePrecision).super_ParameterBase.defaultValue_ = false;
  (this->StatFilePrecision).super_ParameterBase.empty_ = true;
  (this->StatFilePrecision).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd370;
  local_190 = &(this->HydroPropFile).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_190);
  (this->Viscosity).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Viscosity).super_ParameterBase.keyword_.field_2;
  (this->Viscosity).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Viscosity).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Viscosity).super_ParameterBase.optional_ = false;
  (this->Viscosity).super_ParameterBase.defaultValue_ = false;
  (this->Viscosity).super_ParameterBase.empty_ = true;
  (this->Viscosity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->BeadSize).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->BeadSize).super_ParameterBase.keyword_.field_2;
  (this->BeadSize).super_ParameterBase.keyword_._M_string_length = 0;
  (this->BeadSize).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->BeadSize).super_ParameterBase.optional_ = false;
  (this->BeadSize).super_ParameterBase.defaultValue_ = false;
  (this->BeadSize).super_ParameterBase.empty_ = true;
  (this->BeadSize).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_.field_2;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0'
  ;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.optional_ = false;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.defaultValue_ = false;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.empty_ = true;
  (this->UseSphericalBoundaryConditions).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->SkipPairLoop).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SkipPairLoop).super_ParameterBase.keyword_.field_2;
  (this->SkipPairLoop).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SkipPairLoop).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SkipPairLoop).super_ParameterBase.optional_ = false;
  (this->SkipPairLoop).super_ParameterBase.defaultValue_ = false;
  (this->SkipPairLoop).super_ParameterBase.empty_ = true;
  (this->SkipPairLoop).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->FrozenBufferRadius).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->FrozenBufferRadius).super_ParameterBase.keyword_.field_2;
  (this->FrozenBufferRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->FrozenBufferRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->FrozenBufferRadius).super_ParameterBase.optional_ = false;
  (this->FrozenBufferRadius).super_ParameterBase.defaultValue_ = false;
  local_198 = &(this->Viscosity).super_ParameterBase;
  (this->FrozenBufferRadius).super_ParameterBase.empty_ = true;
  (this->FrozenBufferRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->LangevinBufferRadius).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->LangevinBufferRadius).super_ParameterBase.keyword_.field_2;
  (this->LangevinBufferRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->LangevinBufferRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->LangevinBufferRadius).super_ParameterBase.optional_ = false;
  (this->LangevinBufferRadius).super_ParameterBase.defaultValue_ = false;
  local_1a0 = &(this->BeadSize).super_ParameterBase;
  (this->LangevinBufferRadius).super_ParameterBase.empty_ = true;
  (this->LangevinBufferRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->AccumulateBoxDipole).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->AccumulateBoxDipole).super_ParameterBase.keyword_.field_2;
  (this->AccumulateBoxDipole).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AccumulateBoxDipole).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AccumulateBoxDipole).super_ParameterBase.optional_ = false;
  (this->AccumulateBoxDipole).super_ParameterBase.defaultValue_ = false;
  local_2c0 = &(this->UseSphericalBoundaryConditions).super_ParameterBase;
  (this->AccumulateBoxDipole).super_ParameterBase.empty_ = true;
  (this->AccumulateBoxDipole).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_.field_2;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AccumulateBoxQuadrupole).super_ParameterBase.optional_ = false;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.defaultValue_ = false;
  local_230 = &(this->SkipPairLoop).super_ParameterBase;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.empty_ = true;
  (this->AccumulateBoxQuadrupole).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->NeighborListNeighbors).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->NeighborListNeighbors).super_ParameterBase.keyword_.field_2;
  (this->NeighborListNeighbors).super_ParameterBase.keyword_._M_string_length = 0;
  (this->NeighborListNeighbors).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->NeighborListNeighbors).super_ParameterBase.optional_ = false;
  (this->NeighborListNeighbors).super_ParameterBase.defaultValue_ = false;
  local_1a8 = &(this->FrozenBufferRadius).super_ParameterBase;
  (this->NeighborListNeighbors).super_ParameterBase.empty_ = true;
  (this->NeighborListNeighbors).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd370;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_.field_2;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseMultipleTemperatureMethod).super_ParameterBase.optional_ = false;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.defaultValue_ = false;
  local_1b0 = &(this->LangevinBufferRadius).super_ParameterBase;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.empty_ = true;
  (this->UseMultipleTemperatureMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  (this->MTM_Ce).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MTM_Ce).super_ParameterBase.keyword_.field_2;
  (this->MTM_Ce).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_Ce).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_Ce).super_ParameterBase.optional_ = false;
  (this->MTM_Ce).super_ParameterBase.defaultValue_ = false;
  local_2d0 = &(this->AccumulateBoxDipole).super_ParameterBase;
  (this->MTM_Ce).super_ParameterBase.empty_ = true;
  (this->MTM_Ce).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->MTM_G).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MTM_G).super_ParameterBase.keyword_.field_2;
  (this->MTM_G).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_G).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_G).super_ParameterBase.optional_ = false;
  (this->MTM_G).super_ParameterBase.defaultValue_ = false;
  local_2d8 = &(this->AccumulateBoxQuadrupole).super_ParameterBase;
  (this->MTM_G).super_ParameterBase.empty_ = true;
  (this->MTM_G).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002bd2f8
  ;
  (this->MTM_Io).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MTM_Io).super_ParameterBase.keyword_.field_2;
  (this->MTM_Io).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_Io).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_Io).super_ParameterBase.optional_ = false;
  (this->MTM_Io).super_ParameterBase.defaultValue_ = false;
  local_1c0 = &(this->NeighborListNeighbors).super_ParameterBase;
  (this->MTM_Io).super_ParameterBase.empty_ = true;
  (this->MTM_Io).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->MTM_Sigma).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MTM_Sigma).super_ParameterBase.keyword_.field_2;
  (this->MTM_Sigma).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_Sigma).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_Sigma).super_ParameterBase.optional_ = false;
  (this->MTM_Sigma).super_ParameterBase.defaultValue_ = false;
  local_1c8 = &(this->UseMultipleTemperatureMethod).super_ParameterBase;
  (this->MTM_Sigma).super_ParameterBase.empty_ = true;
  (this->MTM_Sigma).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  (this->MTM_R).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MTM_R).super_ParameterBase.keyword_.field_2;
  (this->MTM_R).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_R).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_R).super_ParameterBase.optional_ = false;
  (this->MTM_R).super_ParameterBase.defaultValue_ = false;
  local_1d0 = &(this->MTM_Ce).super_ParameterBase;
  (this->MTM_R).super_ParameterBase.empty_ = true;
  (this->MTM_R).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002bd2f8
  ;
  (this->UseRestraints).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UseRestraints).super_ParameterBase.keyword_.field_2;
  (this->UseRestraints).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseRestraints).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseRestraints).super_ParameterBase.optional_ = false;
  (this->UseRestraints).super_ParameterBase.defaultValue_ = false;
  local_1d8 = &(this->MTM_G).super_ParameterBase;
  local_1e0 = &(this->MTM_Io).super_ParameterBase;
  (this->UseRestraints).super_ParameterBase.empty_ = true;
  local_1e8 = &(this->MTM_Sigma).super_ParameterBase;
  (this->UseRestraints).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd280;
  local_1f8 = &(this->MTM_R).super_ParameterBase;
  local_2e0 = &(this->UseRestraints).super_ParameterBase;
  local_300 = &this->Restraint_file;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(local_300);
  this_02 = &this->HULL_Method;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(this_02);
  (this->Alpha).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Alpha).super_ParameterBase.keyword_.field_2;
  (this->Alpha).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Alpha).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Alpha).super_ParameterBase.optional_ = false;
  (this->Alpha).super_ParameterBase.defaultValue_ = false;
  (this->Alpha).super_ParameterBase.empty_ = true;
  (this->Alpha).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002bd2f8
  ;
  (this->MDfileVersion).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MDfileVersion).super_ParameterBase.keyword_.field_2;
  (this->MDfileVersion).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MDfileVersion).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MDfileVersion).super_ParameterBase.optional_ = false;
  (this->MDfileVersion).super_ParameterBase.defaultValue_ = false;
  local_210 = &(this->Alpha).super_ParameterBase;
  (this->MDfileVersion).super_ParameterBase.empty_ = true;
  (this->MDfileVersion).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd370;
  local_150 = &(this->UniformField).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_150);
  local_160 = &(this->MagneticField).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_160);
  (this->UniformGradientStrength).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UniformGradientStrength).super_ParameterBase.keyword_.field_2;
  (this->UniformGradientStrength).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UniformGradientStrength).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UniformGradientStrength).super_ParameterBase.optional_ = false;
  (this->UniformGradientStrength).super_ParameterBase.defaultValue_ = false;
  local_170 = &(this->UniformGradientStrength).super_ParameterBase;
  (this->UniformGradientStrength).super_ParameterBase.empty_ = true;
  (this->UniformGradientStrength).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  local_178 = &(this->UniformGradientDirection1).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_178);
  local_180 = &(this->UniformGradientDirection2).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_180);
  local_148 = &(this->ElectricField).super_ParameterBase;
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)local_148);
  (this->ConstraintTime).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ConstraintTime).super_ParameterBase.keyword_.field_2;
  (this->ConstraintTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConstraintTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConstraintTime).super_ParameterBase.optional_ = false;
  (this->ConstraintTime).super_ParameterBase.defaultValue_ = false;
  local_220 = &(this->ConstraintTime).super_ParameterBase;
  (this->ConstraintTime).super_ParameterBase.empty_ = true;
  (this->ConstraintTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd2f8;
  local_238 = &(this->PotentialSelection).super_ParameterBase;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_238);
  this_03 = &this->PrivilegedAxis;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter(this_03);
  p_Var1 = &(this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->components_).super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->components_).super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->zconstraints_).
  super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zconstraints_).
  super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zconstraints_).
  super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->restraints_).
  super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->restraints_).
  super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->restraints_).
  super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->taggedAtomPair_).first = 0;
  (this->taggedAtomPair_).second = 0;
  this_04 = (FluctuatingChargeParameters *)operator_new(0x2e8);
  FluctuatingChargeParameters::FluctuatingChargeParameters(this_04);
  this->flucQpars_ = this_04;
  this_05 = (RNEMDParameters *)operator_new(0x7b0);
  RNEMD::RNEMDParameters::RNEMDParameters(this_05);
  this->rnemdPars_ = this_05;
  this_06 = (LightParameters *)operator_new(0x220);
  Perturbations::LightParameters::LightParameters(this_06);
  this->lightPars_ = this_06;
  this_07 = (MinimizerParameters *)operator_new(0x228);
  MinimizerParameters::MinimizerParameters(this_07);
  this->minimizerPars_ = this_07;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"forceField",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ForceField).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"forceField",&local_349);
  local_328.first._M_string_length = local_340;
  this_00 = &(this->super_DataHolder).parameters_;
  paVar2 = &local_328.first.field_2;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_48;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"targetTemp",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->TargetTemp).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->TargetTemp).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"targetTemp",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_50;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"ensemble",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->Ensemble).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->Ensemble).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"ensemble",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_58;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"dt",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->Dt).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->Dt).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"dt",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_60;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"runTime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->RunTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->RunTime).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"runTime",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_68;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"finalConfig",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->FinalConfig).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->FinalConfig).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"finalConfig",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_70;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"sampleTime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->SampleTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->SampleTime).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"sampleTime",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_78;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"resetTime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ResetTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ResetTime).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"resetTime",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_80;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"statusTime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->StatusTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->StatusTime).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"statusTime",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_88;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"cutoffRadius",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->CutoffRadius).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->CutoffRadius).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"cutoffRadius",&local_349)
  ;
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_90;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"switchingRadius",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->SwitchingRadius).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->SwitchingRadius).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"switchingRadius",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_98;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"tempSet",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->TempSet).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->TempSet).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"tempSet",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_a0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"thermalTime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ThermalTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ThermalTime).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"thermalTime",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_a8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"targetPressure",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->TargetPressure).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->TargetPressure).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"targetPressure",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_b0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"tauThermostat",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->TauThermostat).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->TauThermostat).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"tauThermostat",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_b8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"tauBarostat",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->TauBarostat).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->TauBarostat).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"tauBarostat",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_c0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"langevinPistonDrag",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->LangevinPistonDrag).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->LangevinPistonDrag).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"langevinPistonDrag",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_c8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"zconsTime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ZconsTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ZconsTime).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"zconsTime",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_d0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"zconsTol",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ZconsTol).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ZconsTol).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"zconsTol",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_d8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"zconsForcePolicy",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ZconsForcePolicy).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ZconsForcePolicy).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"zconsForcePolicy",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_e0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"seed",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->Seed).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->Seed).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"seed",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_e8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"zconsGap",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ZconsGap).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ZconsGap).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"zconsGap",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_f0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"zconsFixtime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ZconsFixtime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ZconsFixtime).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"zconsFixtime",&local_349)
  ;
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_f8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"zconsUsingSMD",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ZconsUsingSMD).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ZconsUsingSMD).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"zconsUsingSMD",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_100;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"thermodynamicIntegrationLambda",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"thermodynamicIntegrationLambda",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_108;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"thermodynamicIntegrationK",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ThermodynamicIntegrationK).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ThermodynamicIntegrationK).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"thermodynamicIntegrationK",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_110;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"forceFieldVariant",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ForceFieldVariant).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_328);
  (this->ForceFieldVariant).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"forceFieldVariant",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_118;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"forceFieldFileName",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ForceFieldFileName).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ForceFieldFileName).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"forceFieldFileName",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_120;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"dampingAlpha",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->DampingAlpha).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->DampingAlpha).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"dampingAlpha",&local_349)
  ;
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_130;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"surfaceTension",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->SurfaceTension).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->SurfaceTension).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"surfaceTension",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_128;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"printPressureTensor",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->PrintPressureTensor).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->PrintPressureTensor).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"printPressureTensor",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_138;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"printVirialTensor",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->PrintVirialTensor).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_328);
  (this->PrintVirialTensor).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"printVirialTensor",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_140;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"electricField",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ElectricField).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ElectricField).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"electricField",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_148;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"uniformField",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->UniformField).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UniformField).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"uniformField",&local_349)
  ;
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_150;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"magneticField",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->MagneticField).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->MagneticField).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"magneticField",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_160;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"uniformGradientStrength",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UniformGradientStrength).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UniformGradientStrength).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"uniformGradientStrength",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_170;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"uniformGradientDirection1",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UniformGradientDirection1).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UniformGradientDirection1).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"uniformGradientDirection1",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_178;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"uniformGradientDirection2",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UniformGradientDirection2).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UniformGradientDirection2).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"uniformGradientDirection2",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_180;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"taggedAtomPair",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->TaggedAtomPair).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->TaggedAtomPair).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"taggedAtomPair",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_158;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"printTaggedPairDistance",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->PrintTaggedPairDistance).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->PrintTaggedPairDistance).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"printTaggedPairDistance",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_168;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"switchingFunctionType",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->SwitchingFunctionType).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->SwitchingFunctionType).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"switchingFunctionType",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_188;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"HydroPropFile",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->HydroPropFile).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->HydroPropFile).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"HydroPropFile",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_190;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"viscosity",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->Viscosity).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->Viscosity).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"viscosity",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_198;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"beadSize",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->BeadSize).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->BeadSize).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"beadSize",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1a0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"frozenBufferRadius",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->FrozenBufferRadius).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->FrozenBufferRadius).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"frozenBufferRadius",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1a8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"langevinBufferRadius",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->LangevinBufferRadius).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->LangevinBufferRadius).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"langevinBufferRadius",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1b0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"NeighborListNeighbors",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->NeighborListNeighbors).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->NeighborListNeighbors).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"NeighborListNeighbors",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1c0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useMultipleTemperatureMethod",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseMultipleTemperatureMethod).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useMultipleTemperatureMethod",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1c8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"electrostaticSummationMethod",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ElectrostaticSummationMethod).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ElectrostaticSummationMethod).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"electrostaticSummationMethod",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1b8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"MTM_Ce",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->MTM_Ce).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->MTM_Ce).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"MTM_Ce",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1d0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"MTM_G",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->MTM_G).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->MTM_G).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"MTM_G",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1d8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"MTM_Io",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->MTM_Io).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->MTM_Io).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"MTM_Io",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1e0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"MTM_Sigma",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->MTM_Sigma).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->MTM_Sigma).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"MTM_Sigma",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1e8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"MTM_R",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->MTM_R).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->MTM_R).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"MTM_R",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1f8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"alpha",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->Alpha).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->Alpha).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"alpha",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_210;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"constraintTime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->ConstraintTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ConstraintTime).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"constraintTime",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_220;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"potentialSelection",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->PotentialSelection).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->PotentialSelection).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"potentialSelection",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_238;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"skipPairLoop",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->SkipPairLoop).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->SkipPairLoop).super_ParameterBase.optional_ = true;
  (this->SkipPairLoop).super_ParameterBase.defaultValue_ = true;
  (this->SkipPairLoop).super_ParameterBase.empty_ = false;
  (this->SkipPairLoop).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"skipPairLoop",&local_349)
  ;
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_230;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"usePeriodicBoundaryConditions",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.optional_ = true;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.defaultValue_ = true;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.empty_ = false;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"usePeriodicBoundaryConditions",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_1f0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"conserveLinearMomentum",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ConserveLinearMomentum).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ConserveLinearMomentum).super_ParameterBase.optional_ = true;
  (this->ConserveLinearMomentum).super_ParameterBase.defaultValue_ = true;
  (this->ConserveLinearMomentum).super_ParameterBase.empty_ = false;
  (this->ConserveLinearMomentum).super_ParameterBase.field_0x2b = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"conserveLinearMomentum",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_200;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"conserveAngularMomentum",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ConserveAngularMomentum).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ConserveAngularMomentum).super_ParameterBase.optional_ = true;
  (this->ConserveAngularMomentum).super_ParameterBase.defaultValue_ = true;
  (this->ConserveAngularMomentum).super_ParameterBase.empty_ = false;
  (this->ConserveAngularMomentum).super_ParameterBase.field_0x2b = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"conserveAngularMomentum",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_208;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useAtomicVirial",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->UseAtomicVirial).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseAtomicVirial).super_ParameterBase.optional_ = true;
  (this->UseAtomicVirial).super_ParameterBase.defaultValue_ = true;
  (this->UseAtomicVirial).super_ParameterBase.empty_ = false;
  (this->UseAtomicVirial).super_ParameterBase.field_0x2b = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useAtomicVirial",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_218;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useLongRangeCorrections",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UseLongRangeCorrections).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseLongRangeCorrections).super_ParameterBase.optional_ = true;
  (this->UseLongRangeCorrections).super_ParameterBase.defaultValue_ = true;
  (this->UseLongRangeCorrections).super_ParameterBase.empty_ = false;
  (this->UseLongRangeCorrections).super_ParameterBase.field_0x2b = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useLongRangeCorrections",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_228;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useInitialTime",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->UseInitalTime).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseInitalTime).super_ParameterBase.optional_ = true;
  (this->UseInitalTime).super_ParameterBase.defaultValue_ = true;
  (this->UseInitalTime).super_ParameterBase.empty_ = false;
  (this->UseInitalTime).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useInitialTime",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_240;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useInitialExtendedSystemState",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UseIntialExtendedSystemState).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseIntialExtendedSystemState).super_ParameterBase.optional_ = true;
  (this->UseIntialExtendedSystemState).super_ParameterBase.defaultValue_ = true;
  (this->UseIntialExtendedSystemState).super_ParameterBase.empty_ = false;
  (this->UseIntialExtendedSystemState).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useInitialExtendedSystemState",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_248;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"orthoBoxTolerance",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->OrthoBoxTolerance).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_328);
  (this->OrthoBoxTolerance).super_ParameterBase.optional_ = true;
  (this->OrthoBoxTolerance).super_ParameterBase.defaultValue_ = true;
  (this->OrthoBoxTolerance).data_ = 1e-06;
  (this->OrthoBoxTolerance).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"orthoBoxTolerance",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_250;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"cutoffMethod",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->CutoffMethod).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->CutoffMethod).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"SHIFTED_FORCE",(allocator<char> *)&local_348);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_2e8,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"cutoffMethod",&local_349)
  ;
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = &local_2e8->super_ParameterBase;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"electrostaticScreeningMethod",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->ElectrostaticScreeningMethod).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"DAMPED",(allocator<char> *)&local_348);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_2f0,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"electrostaticScreeningMethod",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = &local_2f0->super_ParameterBase;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useSurfaceTerm",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->UseSurfaceTerm).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseSurfaceTerm).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useSurfaceTerm",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_258;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useSlabGeometry",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->UseSlabGeometry).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseSlabGeometry).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useSlabGeometry",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_260;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"dielectric",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->Dielectric).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->Dielectric).super_ParameterBase.optional_ = true;
  (this->Dielectric).super_ParameterBase.defaultValue_ = true;
  (this->Dielectric).data_ = 80.0;
  (this->Dielectric).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"dielectric",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_268;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"compressDumpFile",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->CompressDumpFile).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->CompressDumpFile).super_ParameterBase.optional_ = true;
  (this->CompressDumpFile).super_ParameterBase.defaultValue_ = true;
  (this->CompressDumpFile).super_ParameterBase.empty_ = false;
  (this->CompressDumpFile).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"compressDumpFile",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_278;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"printHeatFlux",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->PrintHeatFlux).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->PrintHeatFlux).super_ParameterBase.optional_ = true;
  (this->PrintHeatFlux).super_ParameterBase.defaultValue_ = true;
  (this->PrintHeatFlux).super_ParameterBase.empty_ = false;
  (this->PrintHeatFlux).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"printHeatFlux",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_270;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"outputForceVector",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->OutputForceVector).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_328);
  (this->OutputForceVector).super_ParameterBase.optional_ = true;
  (this->OutputForceVector).super_ParameterBase.defaultValue_ = true;
  (this->OutputForceVector).super_ParameterBase.empty_ = false;
  (this->OutputForceVector).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"outputForceVector",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_280;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"outputParticlePotential",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->OutputParticlePotential).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->OutputParticlePotential).super_ParameterBase.optional_ = true;
  (this->OutputParticlePotential).super_ParameterBase.defaultValue_ = true;
  (this->OutputParticlePotential).super_ParameterBase.empty_ = false;
  (this->OutputParticlePotential).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"outputParticlePotential",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_288;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"outputElectricField",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->OutputElectricField).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->OutputElectricField).super_ParameterBase.optional_ = true;
  (this->OutputElectricField).super_ParameterBase.defaultValue_ = true;
  (this->OutputElectricField).super_ParameterBase.empty_ = false;
  (this->OutputElectricField).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"outputElectricField",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_290;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"outputFluctuatingCharges",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->OutputFluctuatingCharges).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->OutputFluctuatingCharges).super_ParameterBase.optional_ = true;
  (this->OutputFluctuatingCharges).super_ParameterBase.defaultValue_ = true;
  (this->OutputFluctuatingCharges).super_ParameterBase.empty_ = false;
  (this->OutputFluctuatingCharges).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"outputFluctuatingCharges",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_298;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"outputSitePotential",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->OutputSitePotential).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->OutputSitePotential).super_ParameterBase.optional_ = true;
  (this->OutputSitePotential).super_ParameterBase.defaultValue_ = true;
  (this->OutputSitePotential).super_ParameterBase.empty_ = false;
  (this->OutputSitePotential).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"outputSitePotential",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2a0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"outputDensity",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->OutputDensity).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->OutputDensity).super_ParameterBase.optional_ = true;
  (this->OutputDensity).super_ParameterBase.defaultValue_ = true;
  (this->OutputDensity).super_ParameterBase.empty_ = false;
  (this->OutputDensity).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"outputDensity",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2a8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"skinThickness",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->SkinThickness).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->SkinThickness).super_ParameterBase.optional_ = true;
  (this->SkinThickness).super_ParameterBase.defaultValue_ = true;
  (this->SkinThickness).data_ = 1.0;
  (this->SkinThickness).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"skinThickness",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2b0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"statFileFormat",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->StatFileFormat).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->StatFileFormat).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,
             "TIME|TOTAL_ENERGY|POTENTIAL_ENERGY|KINETIC_ENERGY|TEMPERATURE|PRESSURE|VOLUME|CONSERVED_QUANTITY"
             ,(allocator<char> *)&local_348);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_2f8,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"statFileFormat",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = &local_2f8->super_ParameterBase;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"statFilePrecision",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->StatFilePrecision).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_328);
  (this->StatFilePrecision).super_ParameterBase.optional_ = true;
  (this->StatFilePrecision).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->StatFilePrecision).super_ParameterBase.field_0x2c = 8;
  (this->StatFilePrecision).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"statFilePrecision",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2b8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useSphericalBoundaryConditions",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseSphericalBoundaryConditions).super_ParameterBase.optional_ = true;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.defaultValue_ = true;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.empty_ = false;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useSphericalBoundaryConditions",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2c0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"accumulateBoxDipole",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->AccumulateBoxDipole).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->AccumulateBoxDipole).super_ParameterBase.optional_ = true;
  (this->AccumulateBoxDipole).super_ParameterBase.defaultValue_ = true;
  (this->AccumulateBoxDipole).super_ParameterBase.empty_ = false;
  (this->AccumulateBoxDipole).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"accumulateBoxDipole",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2d0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"accumulateBoxQuadrupole",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->AccumulateBoxQuadrupole).super_ParameterBase.optional_ = true;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.defaultValue_ = true;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.empty_ = false;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"accumulateBoxQuadrupole",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2d8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useRestraints",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->UseRestraints).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseRestraints).super_ParameterBase.optional_ = true;
  (this->UseRestraints).super_ParameterBase.defaultValue_ = true;
  (this->UseRestraints).super_ParameterBase.empty_ = false;
  (this->UseRestraints).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useRestraints",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2e0;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"Restraint_file",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->Restraint_file).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->Restraint_file).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"idealCrystal.in",(allocator<char> *)&local_348);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(local_300,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"Restraint_file",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = &local_300->super_ParameterBase;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useThermodynamicIntegration",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign
            ((string *)&(this->UseThermodynamicIntegration).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->UseThermodynamicIntegration).super_ParameterBase.optional_ = true;
  (this->UseThermodynamicIntegration).super_ParameterBase.defaultValue_ = true;
  (this->UseThermodynamicIntegration).super_ParameterBase.empty_ = false;
  (this->UseThermodynamicIntegration).super_ParameterBase.field_0x2b = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"useThermodynamicIntegration",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_328.second = local_2c8;
  local_348 = &local_338;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"HULL_Method",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->HULL_Method).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->HULL_Method).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"Convex",(allocator<char> *)&local_348);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(this_02,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"HULL_Method",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_348 = &local_338;
  local_328.second = &this_02->super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"privilegedAxis",(allocator<char> *)&local_348);
  std::__cxx11::string::_M_assign((string *)&(this->PrivilegedAxis).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_328);
  (this->PrivilegedAxis).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"z",(allocator<char> *)&local_348);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue(this_03,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"privilegedAxis",&local_349);
  local_328.first._M_string_length = local_340;
  if (local_348 == &local_338) {
    local_328.first.field_2._8_8_ = local_338._8_8_;
    local_328.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_328.first._M_dataplus._M_p = (pointer)local_348;
  }
  local_328.first.field_2._M_allocated_capacity._1_7_ = local_338._M_allocated_capacity._1_7_;
  local_328.first.field_2._M_local_buf[0] = local_338._M_local_buf[0];
  local_340 = 0;
  local_338._M_local_buf[0] = '\0';
  local_348 = &local_338;
  local_328.second = &this_03->super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"nComponents",(allocator<char> *)&local_348);
  this_01 = &(this->super_DataHolder).deprecatedKeywords_;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"nZconstraints",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"initialConfig",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"thermIntDistSpringConst",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"thermIntThetaSpringConst",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"thermIntOmegaSpringConst",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useSolidThermInt",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"useLiquidThermInt",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"minimizerMaxIter",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"minimizerWriteFreq",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"minimizerStepSize",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"minimizerFTol",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"minimizerGTol",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"minimizerLSTol",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"minimizerLSMaxIter",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"electricField",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"cutoffPolicy",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"beadSize",(allocator<char> *)&local_348);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_328.first);
  std::__cxx11::string::~string((string *)&local_328);
  return;
}

Assistant:

Globals::Globals() {
    flucQpars_     = new FluctuatingChargeParameters();
    rnemdPars_     = new RNEMD::RNEMDParameters();
    lightPars_     = new Perturbations::LightParameters();
    minimizerPars_ = new MinimizerParameters();

    DefineParameter(ForceField, "forceField");

    DefineOptionalParameter(TargetTemp, "targetTemp");
    DefineOptionalParameter(Ensemble, "ensemble");
    DefineOptionalParameter(Dt, "dt");
    DefineOptionalParameter(RunTime, "runTime");
    DefineOptionalParameter(FinalConfig, "finalConfig");
    DefineOptionalParameter(SampleTime, "sampleTime");
    DefineOptionalParameter(ResetTime, "resetTime");
    DefineOptionalParameter(StatusTime, "statusTime");
    DefineOptionalParameter(CutoffRadius, "cutoffRadius");
    DefineOptionalParameter(SwitchingRadius, "switchingRadius");
    DefineOptionalParameter(TempSet, "tempSet");
    DefineOptionalParameter(ThermalTime, "thermalTime");
    DefineOptionalParameter(TargetPressure, "targetPressure");
    DefineOptionalParameter(TauThermostat, "tauThermostat");
    DefineOptionalParameter(TauBarostat, "tauBarostat");
    DefineOptionalParameter(LangevinPistonDrag, "langevinPistonDrag");
    DefineOptionalParameter(ZconsTime, "zconsTime");
    DefineOptionalParameter(ZconsTol, "zconsTol");
    DefineOptionalParameter(ZconsForcePolicy, "zconsForcePolicy");
    DefineOptionalParameter(Seed, "seed");
    DefineOptionalParameter(ZconsGap, "zconsGap");
    DefineOptionalParameter(ZconsFixtime, "zconsFixtime");
    DefineOptionalParameter(ZconsUsingSMD, "zconsUsingSMD");
    DefineOptionalParameter(ThermodynamicIntegrationLambda,
                            "thermodynamicIntegrationLambda");
    DefineOptionalParameter(ThermodynamicIntegrationK,
                            "thermodynamicIntegrationK");
    DefineOptionalParameter(ForceFieldVariant, "forceFieldVariant");
    DefineOptionalParameter(ForceFieldFileName, "forceFieldFileName");
    DefineOptionalParameter(DampingAlpha, "dampingAlpha");
    DefineOptionalParameter(SurfaceTension, "surfaceTension");
    DefineOptionalParameter(PrintPressureTensor, "printPressureTensor");
    DefineOptionalParameter(PrintVirialTensor, "printVirialTensor");
    DefineOptionalParameter(ElectricField, "electricField");
    DefineOptionalParameter(UniformField, "uniformField");
    // magnetic field optional parameter added
    DefineOptionalParameter(MagneticField, "magneticField");
    DefineOptionalParameter(UniformGradientStrength, "uniformGradientStrength");
    DefineOptionalParameter(UniformGradientDirection1,
                            "uniformGradientDirection1");
    DefineOptionalParameter(UniformGradientDirection2,
                            "uniformGradientDirection2");
    // DefineOptionalParameter(PeriodicField, "periodicField");
    // DefineOptionalParameter(PeriodicFieldStrength, "periodicFieldStrength");

    DefineOptionalParameter(TaggedAtomPair, "taggedAtomPair");
    DefineOptionalParameter(PrintTaggedPairDistance, "printTaggedPairDistance");
    DefineOptionalParameter(SwitchingFunctionType, "switchingFunctionType");
    DefineOptionalParameter(HydroPropFile, "HydroPropFile");
    DefineOptionalParameter(Viscosity, "viscosity");
    DefineOptionalParameter(BeadSize, "beadSize");
    DefineOptionalParameter(FrozenBufferRadius, "frozenBufferRadius");
    DefineOptionalParameter(LangevinBufferRadius, "langevinBufferRadius");
    DefineOptionalParameter(NeighborListNeighbors, "NeighborListNeighbors");
    DefineOptionalParameter(UseMultipleTemperatureMethod,
                            "useMultipleTemperatureMethod");
    DefineOptionalParameter(ElectrostaticSummationMethod,
                            "electrostaticSummationMethod");
    DefineOptionalParameter(MTM_Ce, "MTM_Ce");
    DefineOptionalParameter(MTM_G, "MTM_G");
    DefineOptionalParameter(MTM_Io, "MTM_Io");
    DefineOptionalParameter(MTM_Sigma, "MTM_Sigma");
    DefineOptionalParameter(MTM_R, "MTM_R");
    DefineOptionalParameter(Alpha, "alpha");
    DefineOptionalParameter(ConstraintTime, "constraintTime");

    DefineOptionalParameter(PotentialSelection, "potentialSelection");

    DefineOptionalParameterWithDefaultValue(SkipPairLoop, "skipPairLoop",
                                            false);
    DefineOptionalParameterWithDefaultValue(
        UsePeriodicBoundaryConditions, "usePeriodicBoundaryConditions", true);
    DefineOptionalParameterWithDefaultValue(ConserveLinearMomentum,
                                            "conserveLinearMomentum", true);
    DefineOptionalParameterWithDefaultValue(ConserveAngularMomentum,
                                            "conserveAngularMomentum", true);
    DefineOptionalParameterWithDefaultValue(UseAtomicVirial, "useAtomicVirial",
                                            true);
    DefineOptionalParameterWithDefaultValue(UseLongRangeCorrections,
                                            "useLongRangeCorrections", true);
    DefineOptionalParameterWithDefaultValue(UseInitalTime, "useInitialTime",
                                            false);
    DefineOptionalParameterWithDefaultValue(
        UseIntialExtendedSystemState, "useInitialExtendedSystemState", false);
    DefineOptionalParameterWithDefaultValue(OrthoBoxTolerance,
                                            "orthoBoxTolerance", 1E-6);
    DefineOptionalParameterWithDefaultValue(CutoffMethod, "cutoffMethod",
                                            "SHIFTED_FORCE");
    DefineOptionalParameterWithDefaultValue(
        ElectrostaticScreeningMethod, "electrostaticScreeningMethod", "DAMPED");
    DefineOptionalParameter(UseSurfaceTerm, "useSurfaceTerm");
    DefineOptionalParameter(UseSlabGeometry, "useSlabGeometry");
    DefineOptionalParameterWithDefaultValue(Dielectric, "dielectric", 80.0);
    DefineOptionalParameterWithDefaultValue(CompressDumpFile,
                                            "compressDumpFile", false);
    DefineOptionalParameterWithDefaultValue(PrintHeatFlux, "printHeatFlux",
                                            false);
    DefineOptionalParameterWithDefaultValue(OutputForceVector,
                                            "outputForceVector", false);
    DefineOptionalParameterWithDefaultValue(OutputParticlePotential,
                                            "outputParticlePotential", false);
    DefineOptionalParameterWithDefaultValue(OutputElectricField,
                                            "outputElectricField", false);
    DefineOptionalParameterWithDefaultValue(OutputFluctuatingCharges,
                                            "outputFluctuatingCharges", false);
    DefineOptionalParameterWithDefaultValue(OutputSitePotential,
                                            "outputSitePotential", false);
    DefineOptionalParameterWithDefaultValue(OutputDensity, "outputDensity",
                                            false);
    DefineOptionalParameterWithDefaultValue(SkinThickness, "skinThickness",
                                            1.0);
    DefineOptionalParameterWithDefaultValue(
        StatFileFormat, "statFileFormat",
        "TIME|TOTAL_ENERGY|POTENTIAL_ENERGY|KINETIC_ENERGY|TEMPERATURE|"
        "PRESSURE|"
        "VOLUME|"
        "CONSERVED_QUANTITY");
    DefineOptionalParameterWithDefaultValue(StatFilePrecision,
                                            "statFilePrecision", 8);
    DefineOptionalParameterWithDefaultValue(UseSphericalBoundaryConditions,
                                            "useSphericalBoundaryConditions",
                                            false);
    DefineOptionalParameterWithDefaultValue(AccumulateBoxDipole,
                                            "accumulateBoxDipole", false);
    DefineOptionalParameterWithDefaultValue(AccumulateBoxQuadrupole,
                                            "accumulateBoxQuadrupole", false);
    DefineOptionalParameterWithDefaultValue(UseRestraints, "useRestraints",
                                            false);
    DefineOptionalParameterWithDefaultValue(Restraint_file, "Restraint_file",
                                            "idealCrystal.in");
    DefineOptionalParameterWithDefaultValue(
        UseThermodynamicIntegration, "useThermodynamicIntegration", false);
    DefineOptionalParameterWithDefaultValue(HULL_Method, "HULL_Method",
                                            "Convex");

    DefineOptionalParameterWithDefaultValue(PrivilegedAxis, "privilegedAxis",
                                            "z");

    deprecatedKeywords_.insert("nComponents");
    deprecatedKeywords_.insert("nZconstraints");
    deprecatedKeywords_.insert("initialConfig");
    deprecatedKeywords_.insert("thermIntDistSpringConst");
    deprecatedKeywords_.insert("thermIntThetaSpringConst");
    deprecatedKeywords_.insert("thermIntOmegaSpringConst");
    deprecatedKeywords_.insert("useSolidThermInt");
    deprecatedKeywords_.insert("useLiquidThermInt");
    deprecatedKeywords_.insert("minimizerMaxIter");
    deprecatedKeywords_.insert("minimizerWriteFreq");
    deprecatedKeywords_.insert("minimizerStepSize");
    deprecatedKeywords_.insert("minimizerFTol");
    deprecatedKeywords_.insert("minimizerGTol");
    deprecatedKeywords_.insert("minimizerLSTol");
    deprecatedKeywords_.insert("minimizerLSMaxIter");
    deprecatedKeywords_.insert("electricField");
    deprecatedKeywords_.insert("cutoffPolicy");
    deprecatedKeywords_.insert("beadSize");
  }